

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O3

void test_hsort_is_sorted(uchar *elements,size_t n,size_t len)

{
  byte bVar1;
  uchar *puVar2;
  size_t sVar3;
  size_t sVar4;
  uchar auStack_50 [32];
  
  if (1 < n) {
    puVar2 = elements + len;
    sVar3 = 1;
    do {
      if (len != 0) {
        sVar4 = 0;
        do {
          bVar1 = *(byte *)((long)((secp256k1_fe *)elements)->n + sVar4);
          if (bVar1 != puVar2[sVar4]) {
            if (puVar2[sVar4] < bVar1) {
              test_hsort_is_sorted_cold_1();
              while( true ) {
                testrand256(auStack_50);
                secp256k1_fe_impl_set_b32_mod((secp256k1_fe *)elements,auStack_50);
                if (((secp256k1_fe *)elements)->n[0] < 0xffffefffffc2f) {
                  return;
                }
                if (((secp256k1_fe *)elements)->n[4] != 0xffffffffffff) break;
                if ((((secp256k1_fe *)elements)->n[2] & ((secp256k1_fe *)elements)->n[3] &
                    ((secp256k1_fe *)elements)->n[1]) != 0xfffffffffffff) {
                  return;
                }
              }
              return;
            }
            break;
          }
          sVar4 = sVar4 + 1;
        } while (sVar4 != len);
      }
      sVar3 = sVar3 + 1;
      puVar2 = puVar2 + len;
      elements = (uchar *)((long)((secp256k1_fe *)elements)->n + len);
    } while (sVar3 != n);
  }
  return;
}

Assistant:

static void test_hsort_is_sorted(unsigned char *elements, size_t n, size_t len) {
    size_t i;
    for (i = 1; i < n; i++) {
        CHECK(secp256k1_memcmp_var(&elements[(i-1) * len], &elements[i * len], len) <= 0);
    }
}